

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O2

int jp2_cdef_putdata(jp2_box_t *box,jas_stream_t *out)

{
  uint_fast8_t *puVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  iVar2 = jp2_putuint16(out,(box->data).bpcc.numcmpts);
  if (iVar2 == 0) {
    uVar4 = 0;
    do {
      if ((box->data).ftyp.majver <= (ulong)uVar4) {
        return 0;
      }
      puVar1 = (box->data).bpcc.bpcs;
      lVar3 = (ulong)uVar4 * 0x18;
      iVar2 = jp2_putuint16(out,*(uint_fast16_t *)(puVar1 + lVar3));
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = jp2_putuint16(out,*(uint_fast16_t *)(puVar1 + lVar3 + 8));
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = jp2_putuint16(out,*(uint_fast16_t *)(puVar1 + lVar3 + 0x10));
      uVar4 = uVar4 + 1;
    } while (iVar2 == 0);
  }
  return -1;
}

Assistant:

static int jp2_cdef_putdata(jp2_box_t *box, jas_stream_t *out)
{
	jp2_cdef_t *cdef = &box->data.cdef;
	unsigned int i;
	jp2_cdefchan_t *ent;

	if (jp2_putuint16(out, cdef->numchans)) {
		return -1;
	}

	for (i = 0; i < cdef->numchans; ++i) {
		ent = &cdef->ents[i];
		if (jp2_putuint16(out, ent->channo) ||
		  jp2_putuint16(out, ent->type) ||
		  jp2_putuint16(out, ent->assoc)) {
			return -1;
		}
	}
	return 0;
}